

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O1

optional<metaf::RunwayStateGroup::Deposits> metaf::RunwayStateGroup::depositsFromString(string *s)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((s->_M_string_length == 1) && (bVar1 = *(s->_M_dataplus)._M_p - 0x2f, bVar1 < 0xb)) {
    uVar2 = *(ulong *)(&DAT_0027acc8 + (ulong)bVar1 * 8);
    uVar3 = 0x100000000;
  }
  else {
    uVar2 = 0;
    uVar3 = 0;
  }
  return (optional<metaf::RunwayStateGroup::Deposits>)(uVar2 | uVar3);
}

Assistant:

std::optional<RunwayStateGroup::Deposits> RunwayStateGroup::depositsFromString(
	const std::string & s)
{
	std::optional<Deposits> error;
	if (s.length() != 1) return error;
	switch (s[0]) {
		case '0': return Deposits::CLEAR_AND_DRY;
		case '1': return Deposits::DAMP;
		case '2': return Deposits::WET_AND_WATER_PATCHES;
		case '3': return Deposits::RIME_AND_FROST_COVERED;
		case '4': return Deposits::DRY_SNOW;
		case '5': return Deposits::WET_SNOW;
		case '6': return Deposits::SLUSH;
		case '7': return Deposits::ICE;
		case '8': return Deposits::COMPACTED_OR_ROLLED_SNOW;
		case '9': return Deposits::FROZEN_RUTS_OR_RIDGES;
		case '/': return Deposits::NOT_REPORTED;
		default:  return error;
	}
}